

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O3

void P_DeathThink(player_t *player)

{
  uint uVar1;
  APlayerPawn *pAVar2;
  DBot *pDVar3;
  PClass *pPVar4;
  byte bVar5;
  int iVar6;
  undefined4 extraout_var;
  bool bVar8;
  double dVar9;
  double dVar10;
  DAngle local_20;
  PClass *pPVar7;
  
  player_t::TickPSprites(player);
  pAVar2 = player->mo;
  player->onground = (pAVar2->super_AActor).__Pos.Z <= (pAVar2->super_AActor).floorz;
  pPVar4 = APlayerChunk::RegistrationInfo.MyClass;
  pPVar7 = (pAVar2->super_AActor).super_DThinker.super_DObject.Class;
  if (pPVar7 == (PClass *)0x0) {
    iVar6 = (**(pAVar2->super_AActor).super_DThinker.super_DObject._vptr_DObject)(pAVar2);
    pPVar7 = (PClass *)CONCAT44(extraout_var,iVar6);
    (pAVar2->super_AActor).super_DThinker.super_DObject.Class = pPVar7;
  }
  bVar8 = pPVar7 != (PClass *)0x0;
  if (pPVar7 != pPVar4 && bVar8) {
    do {
      pPVar7 = pPVar7->ParentClass;
      bVar8 = pPVar7 != (PClass *)0x0;
      if (pPVar7 == pPVar4) break;
    } while (pPVar7 != (PClass *)0x0);
  }
  if (bVar8) {
    player->viewheight = 6.0;
    player->deltaviewheight = 0.0;
    if (player->onground == true) {
      dVar9 = (player->mo->super_AActor).Angles.Pitch.Degrees;
      if (-19.0 < dVar9) {
        (player->mo->super_AActor).Angles.Pitch.Degrees = (-19.0 - dVar9) * 0.125 + dVar9;
      }
    }
  }
  else {
    pAVar2 = player->mo;
    if (-1 < (int)(pAVar2->super_AActor).flags.Value) {
      player->deltaviewheight = 0.0;
      dVar9 = player->viewheight;
      dVar10 = (double)(~-(ulong)(6.0 < dVar9) & (ulong)dVar9 |
                       (ulong)(dVar9 + -1.0) & -(ulong)(6.0 < dVar9));
      if ((6.0 < dVar9) || (dVar10 < 6.0)) {
        dVar9 = 6.0;
        if (6.0 <= dVar10) {
          dVar9 = dVar10;
        }
        player->viewheight = dVar9;
      }
      dVar9 = (pAVar2->super_AActor).Angles.Pitch.Degrees;
      if (0.0 <= dVar9) {
        if (0.0 < dVar9) {
          dVar10 = -3.0;
          goto LAB_004698fc;
        }
      }
      else {
        dVar10 = 3.0;
LAB_004698fc:
        dVar9 = dVar9 + dVar10;
        (pAVar2->super_AActor).Angles.Pitch.Degrees = dVar9;
      }
      if (ABS(dVar9) < 3.0) {
        (pAVar2->super_AActor).Angles.Pitch.Degrees = 0.0;
      }
    }
  }
  P_CalcHeight(player);
  pAVar2 = (APlayerPawn *)(player->attacker).field_0.p;
  if (pAVar2 != (APlayerPawn *)0x0) {
    if (((pAVar2->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) == 0) {
      if (pAVar2 != player->mo) {
        iVar6 = P_FaceMobj(&player->mo->super_AActor,(AActor *)pAVar2,&local_20);
        if (local_20.Degrees < 10.0) {
          if (player->damagecount != 0) {
            player->damagecount = player->damagecount + -1;
          }
          if (player->poisoncount != 0) {
            player->poisoncount = player->poisoncount + -1;
          }
        }
        dVar9 = 5.0;
        if (local_20.Degrees * 0.125 <= 5.0) {
          dVar9 = local_20.Degrees * 0.125;
        }
        pAVar2 = player->mo;
        dVar10 = (pAVar2->super_AActor).Angles.Yaw.Degrees;
        if (iVar6 == 0) {
          (pAVar2->super_AActor).Angles.Yaw.Degrees = dVar10 - dVar9;
        }
        else {
          (pAVar2->super_AActor).Angles.Yaw.Degrees = dVar9 + dVar10;
        }
        goto LAB_004699ff;
      }
    }
    else {
      (player->attacker).field_0.p = (AActor *)0x0;
    }
  }
  if (player->damagecount != 0) {
    player->damagecount = player->damagecount + -1;
  }
  if (player->poisoncount != 0) {
    player->poisoncount = player->poisoncount + -1;
  }
LAB_004699ff:
  uVar1 = (player->cmd).ucmd.buttons;
  if ((((uVar1 & 2) != 0) ||
      (((multiplayer != false || (alwaysapplydmflags.Value == true)) &&
       ((dmflags.Value._1_1_ & 1) != 0)))) && ((dmflags2.Value._1_1_ & 0x40) == 0)) {
    if (level.time < player->respawn_time) {
      if ((uVar1 & 2) == 0) {
        return;
      }
      pDVar3 = (player->Bot).field_0.p;
      if (pDVar3 != (DBot *)0x0) {
        if (((pDVar3->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
          return;
        }
        (player->Bot).field_0.p = (DBot *)0x0;
      }
    }
    player->cls = (PClassPlayerPawn *)0x0;
    bVar5 = 2;
    if ((multiplayer == false) && ((level.flags2._2_1_ & 2) == 0)) {
      bVar5 = sv_singleplayerrespawn.Value ^ 3;
    }
    player->playerstate = bVar5;
    if (2 < (player->mo->super_AActor).special1) {
      (player->mo->super_AActor).special1 = 0;
    }
  }
  return;
}

Assistant:

void P_DeathThink (player_t *player)
{
	int dir;
	DAngle delta;

	player->TickPSprites();

	player->onground = (player->mo->Z() <= player->mo->floorz);
	if (player->mo->IsKindOf (RUNTIME_CLASS(APlayerChunk)))
	{ // Flying bloody skull or flying ice chunk
		player->viewheight = 6;
		player->deltaviewheight = 0;
		if (player->onground)
		{
			if (player->mo->Angles.Pitch > -19.)
			{
				DAngle lookDelta = (-19. - player->mo->Angles.Pitch) / 8;
				player->mo->Angles.Pitch += lookDelta;
			}
		}
	}
	else if (!(player->mo->flags & MF_ICECORPSE))
	{ // Fall to ground (if not frozen)
		player->deltaviewheight = 0;
		if (player->viewheight > 6)
		{
			player->viewheight -= 1;
		}
		if (player->viewheight < 6)
		{
			player->viewheight = 6;
		}
		if (player->mo->Angles.Pitch < 0)
		{
			player->mo->Angles.Pitch += 3;
		}
		else if (player->mo->Angles.Pitch > 0)
		{
			player->mo->Angles.Pitch -= 3;
		}
		if (fabs(player->mo->Angles.Pitch) < 3)
		{
			player->mo->Angles.Pitch = 0.;
		}
	}
	P_CalcHeight (player);
		
	if (player->attacker && player->attacker != player->mo)
	{ // Watch killer
		dir = P_FaceMobj (player->mo, player->attacker, &delta);
		if (delta < 10)
		{ // Looking at killer, so fade damage and poison counters
			if (player->damagecount)
			{
				player->damagecount--;
			}
			if (player->poisoncount)
			{
				player->poisoncount--;
			}
		}
		delta /= 8;
		if (delta > 5.)
		{
			delta = 5.;
		}
		if (dir)
		{ // Turn clockwise
			player->mo->Angles.Yaw += delta;
		}
		else
		{ // Turn counter clockwise
			player->mo->Angles.Yaw -= delta;
		}
	}
	else
	{
		if (player->damagecount)
		{
			player->damagecount--;
		}
		if (player->poisoncount)
		{
			player->poisoncount--;
		}
	}		

	if ((player->cmd.ucmd.buttons & BT_USE ||
		((multiplayer || alwaysapplydmflags) && (dmflags & DF_FORCE_RESPAWN))) && !(dmflags2 & DF2_NO_RESPAWN))
	{
		if (level.time >= player->respawn_time || ((player->cmd.ucmd.buttons & BT_USE) && player->Bot == NULL))
		{
			player->cls = NULL;		// Force a new class if the player is using a random class
			player->playerstate = 
				(multiplayer || (level.flags2 & LEVEL2_ALLOWRESPAWN) || sv_singleplayerrespawn)
				? PST_REBORN : PST_ENTER;
			if (player->mo->special1 > 2)
			{
				player->mo->special1 = 0;
			}
		}
	}
}